

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
::find_non_soo<upb_MiniTable_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
           *this,key_arg<const_upb_MiniTable_*> *key,size_t hash)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint32_t uVar5;
  ctrl_t *pcVar6;
  slot_type *ppuVar7;
  size_t sVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar9;
  ushort x;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  __m128i match;
  ctrl_t cVar12;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  undefined1 auVar13 [16];
  iterator iVar29;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_70;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  bVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
          ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                    *)this);
  if (bVar4) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xdb0,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>, K = const upb_MiniTable *]"
                 );
  }
  probe(&local_70,(CommonFields *)this,hash);
  pcVar6 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
           ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                      *)this);
  auVar11 = ZEXT416((CONCAT11((char)hash,(char)hash) & 0xff7f) & 0xffff7fff);
  auVar11 = pshuflw(auVar11,auVar11,0);
  uVar10 = auVar11._0_4_;
  local_48._4_4_ = uVar10;
  local_48._0_4_ = uVar10;
  local_48._8_4_ = uVar10;
  local_48._12_4_ = uVar10;
  uVar9 = extraout_RDX;
  while( true ) {
    pcVar2 = pcVar6 + local_70.offset_;
    auVar11[0] = -(local_48[0] == *pcVar2);
    auVar11[1] = -(local_48[1] == pcVar2[1]);
    auVar11[2] = -(local_48[2] == pcVar2[2]);
    auVar11[3] = -(local_48[3] == pcVar2[3]);
    auVar11[4] = -(local_48[4] == pcVar2[4]);
    auVar11[5] = -(local_48[5] == pcVar2[5]);
    auVar11[6] = -(local_48[6] == pcVar2[6]);
    auVar11[7] = -(local_48[7] == pcVar2[7]);
    auVar11[8] = -(local_48[8] == pcVar2[8]);
    auVar11[9] = -(local_48[9] == pcVar2[9]);
    auVar11[10] = -(local_48[10] == pcVar2[10]);
    auVar11[0xb] = -(local_48[0xb] == pcVar2[0xb]);
    auVar11[0xc] = -(local_48[0xc] == pcVar2[0xc]);
    auVar11[0xd] = -(local_48[0xd] == pcVar2[0xd]);
    auVar11[0xe] = -(local_48[0xe] == pcVar2[0xe]);
    auVar11[0xf] = -(local_48[0xf] == pcVar2[0xf]);
    cVar12 = *pcVar2;
    cVar14 = pcVar2[1];
    cVar15 = pcVar2[2];
    cVar16 = pcVar2[3];
    cVar17 = pcVar2[4];
    cVar18 = pcVar2[5];
    cVar19 = pcVar2[6];
    cVar20 = pcVar2[7];
    cVar21 = pcVar2[8];
    cVar22 = pcVar2[9];
    cVar23 = pcVar2[10];
    cVar24 = pcVar2[0xb];
    cVar25 = pcVar2[0xc];
    cVar26 = pcVar2[0xd];
    cVar27 = pcVar2[0xe];
    cVar28 = pcVar2[0xf];
    for (x = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf;
        auVar3._8_8_ = 0, auVar3._0_8_ = uVar9, x != 0; x = x - 1 & x) {
      local_58 = cVar12;
      cStack_57 = cVar14;
      cStack_56 = cVar15;
      cStack_55 = cVar16;
      cStack_54 = cVar17;
      cStack_53 = cVar18;
      cStack_52 = cVar19;
      cStack_51 = cVar20;
      cStack_50 = cVar21;
      cStack_4f = cVar22;
      cStack_4e = cVar23;
      cStack_4d = cVar24;
      cStack_4c = cVar25;
      cStack_4b = cVar26;
      cStack_4a = cVar27;
      cStack_49 = cVar28;
      uVar5 = TrailingZeros<unsigned_short>(x);
      ppuVar7 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                              *)this);
      uVar9 = uVar5 + local_70.offset_ & local_70.mask_;
      if (ppuVar7[uVar9] == *key) {
        iVar29 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                 ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                                *)this,uVar9);
        return iVar29;
      }
      uVar9 = extraout_RDX_00;
      cVar12 = local_58;
      cVar14 = cStack_57;
      cVar15 = cStack_56;
      cVar16 = cStack_55;
      cVar17 = cStack_54;
      cVar18 = cStack_53;
      cVar19 = cStack_52;
      cVar20 = cStack_51;
      cVar21 = cStack_50;
      cVar22 = cStack_4f;
      cVar23 = cStack_4e;
      cVar24 = cStack_4d;
      cVar25 = cStack_4c;
      cVar26 = cStack_4b;
      cVar27 = cStack_4a;
      cVar28 = cStack_49;
    }
    auVar13[0] = -(cVar12 == kEmpty);
    auVar13[1] = -(cVar14 == kEmpty);
    auVar13[2] = -(cVar15 == kEmpty);
    auVar13[3] = -(cVar16 == kEmpty);
    auVar13[4] = -(cVar17 == kEmpty);
    auVar13[5] = -(cVar18 == kEmpty);
    auVar13[6] = -(cVar19 == kEmpty);
    auVar13[7] = -(cVar20 == kEmpty);
    auVar13[8] = -(cVar21 == kEmpty);
    auVar13[9] = -(cVar22 == kEmpty);
    auVar13[10] = -(cVar23 == kEmpty);
    auVar13[0xb] = -(cVar24 == kEmpty);
    auVar13[0xc] = -(cVar25 == kEmpty);
    auVar13[0xd] = -(cVar26 == kEmpty);
    auVar13[0xe] = -(cVar27 == kEmpty);
    auVar13[0xf] = -(cVar28 == kEmpty);
    if ((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar13 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar13 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar13 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar13 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar13 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar13 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar13 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar13 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar13 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar13 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar13 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar13 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar13 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar28 == kEmpty)
    break;
    uVar1 = local_70.index_ + 0x10;
    local_70.offset_ = local_70.index_ + local_70.offset_ + 0x10 & local_70.mask_;
    local_70.index_ = uVar1;
    sVar8 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
            ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                        *)this);
    uVar9 = extraout_RDX_01;
    if (sVar8 < uVar1) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdbd,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>, K = const upb_MiniTable *]"
                   );
    }
  }
  return (iterator)(auVar3 << 0x40);
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    assert(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }